

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

Exception syntaxErrorAnalysis(vector<Token,_std::allocator<Token>_> *input)

{
  initializer_list<TokenType> __l;
  initializer_list<TokenType> __l_00;
  initializer_list<TokenType> __l_01;
  initializer_list<TokenType> __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  reference other;
  size_type sVar6;
  reference pvVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_768;
  bool local_75a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_700;
  bool local_6f2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_678;
  bool local_66a;
  byte local_61b;
  allocator<TokenType> local_5f9;
  TokenType local_5f8 [4];
  iterator local_5e8;
  size_type local_5e0;
  vector<TokenType,_std::allocator<TokenType>_> local_5d8;
  allocator<TokenType> local_5b9;
  TokenType local_5b8 [4];
  iterator local_5a8;
  size_type local_5a0;
  vector<TokenType,_std::allocator<TokenType>_> local_598;
  allocator<TokenType> local_579;
  TokenType local_578 [8];
  iterator local_558;
  size_type local_550;
  vector<TokenType,_std::allocator<TokenType>_> local_548;
  allocator<TokenType> local_529;
  TokenType local_528 [6];
  iterator local_510;
  size_type local_508;
  vector<TokenType,_std::allocator<TokenType>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c8;
  undefined1 local_4c7;
  allocator<char> local_4c6;
  allocator<char> local_4c5;
  allocator<char> local_4c4;
  allocator<char> local_4c3;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  undefined1 local_3f8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3ab;
  undefined1 local_3aa;
  allocator<char> local_3a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined1 local_380 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_335;
  undefined1 local_334;
  allocator<char> local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308 [32];
  string local_2e8 [32];
  undefined1 local_2c8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_27c;
  undefined1 local_27b;
  allocator<char> local_27a;
  allocator<char> local_279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250 [32];
  undefined1 local_230 [47];
  byte local_201;
  string local_200;
  byte local_1d9;
  string local_1d8;
  Token local_1b8;
  Token local_190;
  undefined1 local_168 [8];
  Token tmp;
  vector<Token,_std::allocator<Token>_> local_138;
  undefined1 local_120 [8];
  Token nextToken;
  undefined1 local_e0 [8];
  Token prevToken;
  undefined1 local_a8 [8];
  Token token;
  int i;
  int end;
  bool isChar;
  bool isString;
  stack<Token,_std::deque<Token,_std::allocator<Token>_>_> bracketStack;
  int lineIndex;
  vector<Token,_std::allocator<Token>_> *input_local;
  
  bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node._4_4_ = 1;
  std::stack<Token,std::deque<Token,std::allocator<Token>>>::
  stack<std::deque<Token,std::allocator<Token>>,void>
            ((stack<Token,std::deque<Token,std::allocator<Token>>> *)&end);
  bVar3 = false;
  bVar2 = false;
  sVar4 = std::vector<Token,_std::allocator<Token>_>::size(input);
  for (token.source.field_2._12_4_ = 0; (int)token.source.field_2._12_4_ < (int)sVar4 + -1;
      token.source.field_2._12_4_ = token.source.field_2._12_4_ + 1) {
    bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node._4_4_ = getLineIndex(input,token.source.field_2._12_4_);
    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                       (input,(long)(int)token.source.field_2._12_4_);
    Token::Token((Token *)local_a8,pvVar5);
    std::vector<Token,_std::allocator<Token>_>::vector
              ((vector<Token,_std::allocator<Token>_> *)((long)&nextToken.source.field_2 + 8),input)
    ;
    prev((Token *)local_e0,
         (vector<Token,_std::allocator<Token>_> *)((long)&nextToken.source.field_2 + 8),
         token.source.field_2._12_4_);
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)((long)&nextToken.source.field_2 + 8));
    std::vector<Token,_std::allocator<Token>_>::vector(&local_138,input);
    next((Token *)local_120,&local_138,token.source.field_2._12_4_);
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_138);
    bVar1 = Token::isEndOfLine((Token *)local_a8);
    if (bVar1) {
      if ((bVar3) || (bVar2)) {
        Exception::Exception
                  ((Exception *)&input_local,QuotesSequenceError,
                   bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node._4_4_);
        tmp.source.field_2._12_4_ = 1;
      }
      else {
        tmp.source.field_2._12_4_ = 4;
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &token,"\"");
      if ((!bVar1) || (bVar2)) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&token,"\'");
        if ((!bVar1) || (bVar3)) {
          bVar1 = Token::isBracket((Token *)local_a8);
          if (bVar1) {
            bVar1 = Token::isLeftBracket((Token *)local_a8);
            if (bVar1) {
              std::stack<Token,_std::deque<Token,_std::allocator<Token>_>_>::push
                        ((stack<Token,_std::deque<Token,_std::allocator<Token>_>_> *)&end,
                         (value_type *)local_a8);
LAB_00113fcc:
              tmp.source.field_2._12_4_ = 4;
            }
            else {
              bVar1 = std::stack<Token,_std::deque<Token,_std::allocator<Token>_>_>::empty
                                ((stack<Token,_std::deque<Token,_std::allocator<Token>_>_> *)&end);
              if (bVar1) {
                Exception::Exception
                          ((Exception *)&input_local,BracketSequenceError,
                           bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node._4_4_);
                tmp.source.field_2._12_4_ = 1;
              }
              else {
                other = std::stack<Token,_std::deque<Token,_std::allocator<Token>_>_>::top
                                  ((stack<Token,_std::deque<Token,_std::allocator<Token>_>_> *)&end)
                ;
                Token::Token((Token *)local_168,other);
                std::stack<Token,_std::deque<Token,_std::allocator<Token>_>_>::pop
                          ((stack<Token,_std::deque<Token,_std::allocator<Token>_>_> *)&end);
                Token::Token(&local_190,(Token *)local_168);
                Token::Token(&local_1b8,(Token *)local_a8);
                bVar1 = isBracketPair(&local_190,&local_1b8);
                Token::~Token(&local_1b8);
                Token::~Token(&local_190);
                bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
                if (bVar1) {
                  Exception::Exception
                            ((Exception *)&input_local,BracketSequenceError,
                             bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl
                             .super__Deque_impl_data._M_finish._M_node._4_4_);
                }
                tmp.source.field_2._13_3_ = 0;
                tmp.source.field_2._M_local_buf[0xc] = bVar1;
                Token::~Token((Token *)local_168);
                if (tmp.source.field_2._12_4_ == 0) goto LAB_00113fcc;
              }
            }
          }
          else if ((local_a8._0_4_ == CharLiteral) &&
                  (sVar6 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&token), sVar6 != 3)) {
            Exception::Exception
                      ((Exception *)&input_local,CharFormatError,
                       bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node._4_4_);
            tmp.source.field_2._12_4_ = 1;
          }
          else {
            local_1d9 = 0;
            local_201 = 0;
            local_61b = 0;
            if (local_a8._0_4_ == Name) {
              std::__cxx11::string::string
                        ((string *)&local_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&token
                        );
              local_1d9 = 1;
              bVar1 = isCorrectName(&local_1d8);
              local_61b = 0;
              if (!bVar1) {
                std::__cxx11::string::string
                          ((string *)&local_200,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &token);
                local_201 = 1;
                bVar1 = canBeDivided(&local_200);
                local_61b = bVar1 ^ 0xff;
              }
            }
            if ((local_201 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_200);
            }
            if ((local_1d9 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_1d8);
            }
            if ((local_61b & 1) == 0) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&token,".");
              if (bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&prevToken,".");
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&nextToken,"."), bVar1)) {
                  tmp.source.field_2._12_4_ = 4;
                }
                else if ((local_e0._0_4_ == IntNumber) || (local_120._0_4_ != IntNumber)) {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&token,".");
                  if ((bVar1) && (token.source.field_2._12_4_ == 0)) {
                    Exception::Exception
                              ((Exception *)&input_local,UnexpectedDotError,
                               bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                    tmp.source.field_2._12_4_ = 1;
                  }
                  else if (((((local_e0._0_4_ == Keyword) ||
                             (bVar1 = Token::isOperator((Token *)local_e0), bVar1)) ||
                            (local_e0._0_4_ == Constant)) ||
                           (((local_120._0_4_ == Keyword ||
                             (bVar1 = Token::isOperator((Token *)local_120), bVar1)) ||
                            (local_120._0_4_ == Constant)))) &&
                          (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&prevToken,"this"), ((bVar1 ^ 0xffU) & 1) != 0))
                  {
                    Exception::Exception
                              ((Exception *)&input_local,UnexpectedDotError,
                               bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                    tmp.source.field_2._12_4_ = 1;
                  }
                  else {
                    bVar1 = Token::isRightBracket((Token *)local_e0);
                    if ((bVar1) || (local_e0._0_4_ != Punctuation)) {
                      bVar1 = Token::isLeftBracket((Token *)local_120);
                      if ((bVar1) || (local_120._0_4_ != Punctuation)) goto LAB_0011444f;
                      Exception::Exception
                                ((Exception *)&input_local,UnexpectedDotError,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                    }
                    else {
                      Exception::Exception
                                ((Exception *)&input_local,UnexpectedDotError,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                    }
                  }
                }
                else {
                  Exception::Exception
                            ((Exception *)&input_local,MemberError,
                             bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl
                             .super__Deque_impl_data._M_finish._M_node._4_4_);
                  tmp.source.field_2._12_4_ = 1;
                }
              }
              else {
LAB_0011444f:
                if ((((local_a8._0_4_ == IntNumber) && (1 < (int)token.source.field_2._12_4_)) &&
                    ((int)token.source.field_2._12_4_ < (int)sVar4 + -2)) &&
                   (pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                       (input,(long)(token.source.field_2._12_4_ + -2)),
                   pvVar5->type == IntNumber)) {
                  pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                     (input,(long)(token.source.field_2._12_4_ + -1));
                  bVar1 = std::operator==(&pvVar5->source,".");
                  if (bVar1) {
                    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                       (input,(long)(token.source.field_2._12_4_ + 1));
                    bVar1 = std::operator==(&pvVar5->source,".");
                    if ((bVar1) &&
                       (pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                           (input,(long)(token.source.field_2._12_4_ + 2)),
                       pvVar5->type == IntNumber)) {
                      Exception::Exception
                                ((Exception *)&input_local,TooManyPointsInNumber,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                      goto LAB_00115aee;
                    }
                  }
                }
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&token,",");
                if (bVar1) {
                  if (token.source.field_2._12_4_ == 0) {
                    Exception::Exception
                              ((Exception *)&input_local,UnexpectedTokenError,
                               bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                    tmp.source.field_2._12_4_ = 1;
                  }
                  else {
                    bVar1 = Token::isRightBracket((Token *)local_e0);
                    if ((bVar1) || (local_e0._0_4_ != Punctuation)) {
                      bVar1 = Token::isLeftBracket((Token *)local_120);
                      if ((bVar1) || (local_120._0_4_ != Punctuation)) {
                        local_27b = 1;
                        local_278 = &local_270;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_270,"+",&local_279);
                        local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_250;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>(local_250,"-",&local_27a)
                        ;
                        local_27b = 0;
                        local_230._0_8_ = &local_270;
                        local_230._8_8_ = 2;
                        std::
                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::allocator(&local_27c);
                        __l_06._M_len = local_230._8_8_;
                        __l_06._M_array = (iterator)local_230._0_8_;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)(local_230 + 0x10),__l_06,&local_27c);
                        std::__cxx11::string::string
                                  ((string *)&local_2a0,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&prevToken);
                        bVar1 = contain<std::__cxx11::string>
                                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)(local_230 + 0x10),&local_2a0);
                        local_66a = false;
                        if (!bVar1) {
                          local_66a = Token::isOperator((Token *)local_e0);
                        }
                        std::__cxx11::string::~string((string *)&local_2a0);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(local_230 + 0x10));
                        std::
                        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~allocator(&local_27c);
                        local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_230;
                        do {
                          local_678 = local_678 + -1;
                          std::__cxx11::string::~string((string *)local_678);
                        } while (local_678 != &local_270);
                        std::allocator<char>::~allocator(&local_27a);
                        std::allocator<char>::~allocator(&local_279);
                        if (local_66a == false) {
                          local_334 = 1;
                          local_330 = &local_328;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_328,"+",&local_331);
                          local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_308;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_308,"-",&local_332);
                          local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_2e8;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    (local_2e8,"!",&local_333);
                          local_334 = 0;
                          local_2c8._0_8_ = &local_328;
                          local_2c8._8_8_ = 3;
                          std::
                          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::allocator(&local_335);
                          __l_05._M_len = local_2c8._8_8_;
                          __l_05._M_array = (iterator)local_2c8._0_8_;
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)(local_2c8 + 0x10),__l_05,&local_335);
                          std::__cxx11::string::string
                                    ((string *)&local_358,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&nextToken);
                          bVar1 = contain<std::__cxx11::string>
                                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)(local_2c8 + 0x10),&local_358);
                          local_6f2 = false;
                          if (!bVar1) {
                            local_6f2 = Token::isOperator((Token *)local_120);
                          }
                          std::__cxx11::string::~string((string *)&local_358);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)(local_2c8 + 0x10));
                          std::
                          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~allocator(&local_335);
                          local_700 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_2c8;
                          do {
                            local_700 = local_700 + -1;
                            std::__cxx11::string::~string((string *)local_700);
                          } while (local_700 != &local_328);
                          std::allocator<char>::~allocator(&local_333);
                          std::allocator<char>::~allocator(&local_332);
                          std::allocator<char>::~allocator(&local_331);
                          if (local_6f2 == false) {
                            local_3aa = 1;
                            local_3a8 = &local_3a0;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_3a0,"this",&local_3a9);
                            local_3aa = 0;
                            local_380._0_8_ = &local_3a0;
                            local_380._8_8_ = 1;
                            std::
                            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::allocator(&local_3ab);
                            __l_04._M_len = local_380._8_8_;
                            __l_04._M_array = (iterator)local_380._0_8_;
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)(local_380 + 0x10),__l_04,&local_3ab);
                            std::__cxx11::string::string
                                      ((string *)&local_3d0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&prevToken);
                            local_75a = contain<std::__cxx11::string>
                                                  ((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)(local_380 + 0x10),&local_3d0);
                            local_75a = local_75a || local_e0._0_4_ != Keyword;
                            std::__cxx11::string::~string((string *)&local_3d0);
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)(local_380 + 0x10));
                            std::
                            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~allocator(&local_3ab);
                            local_768 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_380;
                            do {
                              local_768 = local_768 + -1;
                              std::__cxx11::string::~string((string *)local_768);
                            } while (local_768 != &local_3a0);
                            std::allocator<char>::~allocator(&local_3a9);
                            if (local_75a) {
                              local_4c7 = 1;
                              local_4c0 = &local_4b8;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_4b8,"this",&local_4c1);
                              local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_498;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_498,"not",&local_4c2);
                              local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_478;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_478,"lambda",&local_4c3);
                              local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_458;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_458,"new",&local_4c4);
                              local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_438;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_438,"ref",&local_4c5);
                              local_4c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_418;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        (local_418,"out",&local_4c6);
                              local_4c7 = 0;
                              local_3f8._0_8_ = &local_4b8;
                              local_3f8._8_8_ = 6;
                              std::
                              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::allocator(&local_4c8);
                              __l_03._M_len = local_3f8._8_8_;
                              __l_03._M_array = (iterator)local_3f8._0_8_;
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)(local_3f8 + 0x10),__l_03,&local_4c8);
                              std::__cxx11::string::string
                                        ((string *)&local_4e8,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&nextToken);
                              bVar1 = contain<std::__cxx11::string>
                                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)(local_3f8 + 0x10),&local_4e8);
                              bVar8 = local_120._0_4_ != Keyword;
                              std::__cxx11::string::~string((string *)&local_4e8);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)(local_3f8 + 0x10));
                              std::
                              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~allocator(&local_4c8);
                              local_820 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_3f8;
                              do {
                                local_820 = local_820 + -1;
                                std::__cxx11::string::~string((string *)local_820);
                              } while (local_820 != &local_4b8);
                              std::allocator<char>::~allocator(&local_4c6);
                              std::allocator<char>::~allocator(&local_4c5);
                              std::allocator<char>::~allocator(&local_4c4);
                              std::allocator<char>::~allocator(&local_4c3);
                              std::allocator<char>::~allocator(&local_4c2);
                              std::allocator<char>::~allocator(&local_4c1);
                              if (bVar1 || bVar8) goto LAB_0011554f;
                              Exception::Exception
                                        ((Exception *)&input_local,UnexpectedTokenError,
                                         bracketStack.c.
                                         super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_node._4_4_);
                              tmp.source.field_2._12_4_ = 1;
                            }
                            else {
                              Exception::Exception
                                        ((Exception *)&input_local,UnexpectedTokenError,
                                         bracketStack.c.
                                         super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_node._4_4_);
                              tmp.source.field_2._12_4_ = 1;
                            }
                          }
                          else {
                            Exception::Exception
                                      ((Exception *)&input_local,UnexpectedTokenError,
                                       bracketStack.c.
                                       super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                                       super__Deque_impl_data._M_finish._M_node._4_4_);
                            tmp.source.field_2._12_4_ = 1;
                          }
                        }
                        else {
                          Exception::Exception
                                    ((Exception *)&input_local,UnexpectedTokenError,
                                     bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                          tmp.source.field_2._12_4_ = 1;
                        }
                      }
                      else {
                        Exception::Exception
                                  ((Exception *)&input_local,UnexpectedTokenError,
                                   bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                        tmp.source.field_2._12_4_ = 1;
                      }
                    }
                    else {
                      Exception::Exception
                                ((Exception *)&input_local,UnexpectedTokenError,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                    }
                  }
                }
                else {
LAB_0011554f:
                  if (local_a8._0_4_ == Name) {
                    if (token.source.field_2._12_4_ != 0) {
                      local_528[0] = Name;
                      local_528[1] = IntNumber;
                      local_528[2] = CharLiteral;
                      local_528[3] = StringLiteral;
                      local_528[4] = 5;
                      local_510 = local_528;
                      local_508 = 5;
                      std::allocator<TokenType>::allocator(&local_529);
                      __l_02._M_len = local_508;
                      __l_02._M_array = local_510;
                      std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                (&local_500,__l_02,&local_529);
                      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                         (input,(long)(token.source.field_2._12_4_ + -1));
                      bVar1 = contain<TokenType>(&local_500,pvVar5->type);
                      std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_500);
                      std::allocator<TokenType>::~allocator(&local_529);
                      if (bVar1) {
                        Exception::Exception
                                  ((Exception *)&input_local,SyntaxError,
                                   bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                        tmp.source.field_2._12_4_ = 1;
                        goto LAB_00115aee;
                      }
                    }
                    local_578[0] = Name;
                    local_578[1] = IntNumber;
                    local_578[2] = CharLiteral;
                    local_578[3] = StringLiteral;
                    local_578[4] = 5;
                    local_558 = local_578;
                    local_550 = 5;
                    std::allocator<TokenType>::allocator(&local_579);
                    __l_01._M_len = local_550;
                    __l_01._M_array = local_558;
                    std::vector<TokenType,_std::allocator<TokenType>_>::vector
                              (&local_548,__l_01,&local_579);
                    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                       (input,(long)(token.source.field_2._12_4_ + 1));
                    bVar1 = contain<TokenType>(&local_548,pvVar5->type);
                    std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_548);
                    std::allocator<TokenType>::~allocator(&local_579);
                    if (bVar1) {
                      Exception::Exception
                                ((Exception *)&input_local,SyntaxError,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                      goto LAB_00115aee;
                    }
                  }
                  if (local_a8._0_4_ == IntNumber) {
                    if (token.source.field_2._12_4_ != 0) {
                      local_5b8[0] = IntNumber;
                      local_5b8[1] = 10;
                      local_5b8[2] = 9;
                      local_5b8[3] = 5;
                      local_5a8 = local_5b8;
                      local_5a0 = 4;
                      std::allocator<TokenType>::allocator(&local_5b9);
                      __l_00._M_len = local_5a0;
                      __l_00._M_array = local_5a8;
                      std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                (&local_598,__l_00,&local_5b9);
                      pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                         (input,(long)(token.source.field_2._12_4_ + -1));
                      bVar1 = contain<TokenType>(&local_598,pvVar5->type);
                      std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_598);
                      std::allocator<TokenType>::~allocator(&local_5b9);
                      if (bVar1) {
                        Exception::Exception
                                  ((Exception *)&input_local,SyntaxError,
                                   bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                   _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                        tmp.source.field_2._12_4_ = 1;
                        goto LAB_00115aee;
                      }
                    }
                    local_5f8[0] = IntNumber;
                    local_5f8[1] = 10;
                    local_5f8[2] = 9;
                    local_5f8[3] = 5;
                    local_5e8 = local_5f8;
                    local_5e0 = 4;
                    std::allocator<TokenType>::allocator(&local_5f9);
                    __l._M_len = local_5e0;
                    __l._M_array = local_5e8;
                    std::vector<TokenType,_std::allocator<TokenType>_>::vector
                              (&local_5d8,__l,&local_5f9);
                    pvVar5 = std::vector<Token,_std::allocator<Token>_>::operator[]
                                       (input,(long)(token.source.field_2._12_4_ + 1));
                    bVar1 = contain<TokenType>(&local_5d8,pvVar5->type);
                    std::vector<TokenType,_std::allocator<TokenType>_>::~vector(&local_5d8);
                    std::allocator<TokenType>::~allocator(&local_5f9);
                    if (bVar1) {
                      Exception::Exception
                                ((Exception *)&input_local,SyntaxError,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                      goto LAB_00115aee;
                    }
                  }
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&token,":");
                  if (bVar1) {
                    if (token.source.field_2._12_4_ == 0) {
                      Exception::Exception
                                ((Exception *)&input_local,SyntaxError,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                    }
                    else {
                      if ((((local_e0._0_4_ == Name) && (local_120._0_4_ == Name)) ||
                          (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&prevToken,")"), ((bVar1 ^ 0xffU) & 1) == 0)) ||
                         (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&nextToken,"="), ((bVar1 ^ 0xffU) & 1) == 0))
                      goto LAB_00115ae4;
                      Exception::Exception
                                ((Exception *)&input_local,SyntaxError,
                                 bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node._4_4_);
                      tmp.source.field_2._12_4_ = 1;
                    }
                  }
                  else {
LAB_00115ae4:
                    tmp.source.field_2._12_4_ = 0;
                  }
                }
              }
            }
            else {
              pvVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&token,0);
              if ((*pvVar7 == '\"') ||
                 (pvVar7 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&token,0), *pvVar7 == '\'')) {
                Exception::Exception
                          ((Exception *)&input_local,QuotesSequenceError,
                           bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node._4_4_);
                tmp.source.field_2._12_4_ = 1;
              }
              else {
                Exception::Exception
                          ((Exception *)&input_local,NameError,
                           bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_node._4_4_);
                tmp.source.field_2._12_4_ = 1;
              }
            }
          }
        }
        else {
          bVar2 = (bool)(bVar2 ^ 1);
          tmp.source.field_2._12_4_ = 4;
        }
      }
      else {
        bVar3 = (bool)(bVar3 ^ 1);
        tmp.source.field_2._12_4_ = 4;
      }
    }
LAB_00115aee:
    Token::~Token((Token *)local_120);
    Token::~Token((Token *)local_e0);
    Token::~Token((Token *)local_a8);
    if ((tmp.source.field_2._12_4_ != 0) && (tmp.source.field_2._12_4_ != 4)) goto LAB_00115bc0;
  }
  bVar3 = std::stack<Token,_std::deque<Token,_std::allocator<Token>_>_>::empty
                    ((stack<Token,_std::deque<Token,_std::allocator<Token>_>_> *)&end);
  if (bVar3) {
    Exception::Exception((Exception *)&input_local,Nothing);
    tmp.source.field_2._12_4_ = 1;
  }
  else {
    Exception::Exception
              ((Exception *)&input_local,BracketSequenceError,
               bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node._4_4_);
    tmp.source.field_2._12_4_ = 1;
  }
LAB_00115bc0:
  std::stack<Token,_std::deque<Token,_std::allocator<Token>_>_>::~stack
            ((stack<Token,_std::deque<Token,_std::allocator<Token>_>_> *)&end);
  return (Exception)input_local;
}

Assistant:

Exception syntaxErrorAnalysis(vector<Token> input) {
	int lineIndex = 1;
	stack<Token> bracketStack;
	bool isString = false, isChar = false;
	// длина входного потока
	int end = input.size();
	// последний символ - EOfF, поэтому читаем до предпоследнего
	for (int i = 0; i < end - 1; ++i) {
		lineIndex = getLineIndex(input, i);
		Token token = input[i];
		Token prevToken = prev(input, i), nextToken = next(input, i);

		if (token.isEndOfLine()) {
			if (isString or isChar) {
				return Exception(QuotesSequenceError, lineIndex);
			}
			continue;
		}
		// обработка строк
		if (token.source == "\"" and not isChar) {
			isString = not isString;
			continue;
		}
		if (token.source == "\'" and not isString) {
			isChar = not isChar;
			continue;
		}
		// обработка скобочных последовательностей
		if (token.isBracket()) {
			if (token.isLeftBracket()) {
				bracketStack.push(token);
			} else {
				if (bracketStack.empty()) {
					return Exception(BracketSequenceError, lineIndex);
				} else {
					Token tmp = bracketStack.top();
					bracketStack.pop();
					if (not isBracketPair(tmp, token))
						return Exception(BracketSequenceError, lineIndex);
				}
			}
			continue;
		}
		// обработка CharFormatError
		if (token.type == CharLiteral and token.source.size() != 3) {
			return Exception(CharFormatError, lineIndex);
		}
		// обработка неправильных имен
		if (token.type == Name and not isCorrectName(token.source) and not canBeDivided(token.source)) {
			if (token.source[0] == '\"' or token.source[0] == '\'') {
				return Exception(QuotesSequenceError, lineIndex);
			}
			return Exception(NameError, lineIndex);
		}
		// MemberError для Int после Name
		// а также UnexpectedDotError - один из операндов точки ключевое слово или оператор и тд
		if (token.source == ".") {
			if (prevToken.source == "." or nextToken.source == ".") continue;
			if (prevToken.type != IntNumber and nextToken.type == IntNumber) {
				return Exception(MemberError, lineIndex);
			}
			if (token.source == "." and i == 0) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (prevToken.type == Keyword or prevToken.isOperator() or prevToken.type == Constant or
			    nextToken.type == Keyword or nextToken.isOperator() or nextToken.type == Constant) {
				if (prevToken.source != "this")
					return Exception(UnexpectedDotError, lineIndex);
			}
			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
		}
		// обработка неправильного использования оператора .  - TooManyPointsInNumber
		if (token.type == IntNumber and i > 1 and i < end - 2) {
			if (input[i - 2].type == IntNumber and input[i - 1].source == "." and
			    input[i + 1].source == "." and input[i + 2].type == IntNumber) {
				return Exception(TooManyPointsInNumber, lineIndex);
			}
		}
		// обработка UnexpectedTokenError
		if (token.source == ",") {
			if (i == 0) return Exception(UnexpectedTokenError, lineIndex);

			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"+", "-"}, prevToken.source) and prevToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"+", "-", "!"}, nextToken.source) and nextToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"this"}, prevToken.source) and prevToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"this", "not", "lambda", "new", "ref", "out"}, nextToken.source) and
			    nextToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
		}

		// SyntaxError
		if (token.type == Name) {
			if (i != 0) {
				if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type))
					return Exception(SyntaxError, lineIndex);
			}
			if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		// TODO: возможны ошибки с Keyword
		if (token.type == IntNumber) {
			if (i != 0) {
				if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type)) {
					return Exception(SyntaxError, lineIndex);
				}
//				if (input[i - 1].type == Keyword and input[i - 1].source != "else") {
//					return Exception(SyntaxError, lineIndex);
//				}
			}
			if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		if (token.source == ":") {
			if (i == 0) return Exception(SyntaxError, lineIndex);
			if ((prevToken.type != Name or nextToken.type != Name) and prevToken.source != ")" and
			    nextToken.source != "=") {
				return Exception(SyntaxError, lineIndex);
			}
		}
	}
	if (not bracketStack.empty()) return Exception(BracketSequenceError, lineIndex);
	return Exception(Nothing);
}